

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O2

void llvm::yaml::skip<llvm::yaml::MappingNode>(MappingNode *C)

{
  KeyValueNode *this;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_18;
  iterator i;
  
  if (C->IsAtBeginning == false) {
    if (C->IsAtEnd == false) {
      __assert_fail("(C.IsAtBeginning || C.IsAtEnd) && \"Cannot skip mid parse!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                    ,0x186,
                    "void llvm::yaml::skip(CollectionType &) [CollectionType = llvm::yaml::MappingNode]"
                   );
    }
  }
  else {
    local_18.Base = (MappingNode *)begin<llvm::yaml::MappingNode>(C);
    while (local_18.Base != (MappingNode *)0x0) {
      this = basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
             operator->(&local_18);
      KeyValueNode::skip(this);
      basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
                (&local_18);
    }
  }
  return;
}

Assistant:

void skip(CollectionType &C) {
  // TODO: support skipping from the middle of a parsed collection ;/
  assert((C.IsAtBeginning || C.IsAtEnd) && "Cannot skip mid parse!");
  if (C.IsAtBeginning)
    for (typename CollectionType::iterator i = begin(C), e = C.end(); i != e;
         ++i)
      i->skip();
}